

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<float>::Print(TPZMatrix<float> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  int64_t col_4;
  long lVar8;
  int64_t col;
  long lVar9;
  long lVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  type_conflict val;
  float extraout_XMM0_Da_04;
  char *local_148;
  anon_class_4_1_2f8713ba PrintVal;
  ios cout_state;
  
  std::ios::ios((ios *)&cout_state,(streambuf *)0x0);
  std::ios::copyfmt(&cout_state);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 9;
  if (EFixedColumn < form) goto LAB_00d150d1;
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  lVar4 = (this->super_TPZBaseMatrix).fCol;
  switch(form) {
  case EFormatted:
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar3 = std::operator<<(out,"\' (");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"):\n");
    lVar10 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar10;
    }
    if (lVar2 < 1) {
      lVar2 = lVar10;
    }
    local_148 = "\n";
    for (; lVar10 != lVar2; lVar10 = lVar10 + 1) {
      std::operator<<(out,"\t");
      for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar10,lVar8);
        poVar3 = (ostream *)std::ostream::operator<<(out,extraout_XMM0_Da);
        std::operator<<(poVar3,"  ");
      }
      std::operator<<(out,"\n");
    }
    goto LAB_00d14e04;
  case EInputFormat:
    poVar3 = std::ostream::_M_insert<long>((long)out);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar10 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar10;
    }
    if (lVar2 < 1) {
      lVar2 = lVar10;
    }
    local_148 = "-1 -1 0.\n";
    for (; lVar10 != lVar2; lVar10 = lVar10 + 1) {
      for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar10,lVar8);
        if ((extraout_XMM0_Da_02 != 0.0) || (NAN(extraout_XMM0_Da_02))) {
          poVar3 = std::ostream::_M_insert<long>((long)out);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,extraout_XMM0_Da_02);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
    }
    goto LAB_00d14e04;
  case EMathematicaInput:
    poVar3 = std::operator<<(out,name);
    std::operator<<(poVar3,"\n{ ");
    lVar8 = 0;
    lVar10 = lVar4;
    if (lVar4 < 1) {
      lVar10 = lVar8;
    }
    lVar5 = lVar2;
    if (lVar2 < 1) {
      lVar5 = lVar8;
    }
    for (; lVar8 != lVar5; lVar8 = lVar8 + 1) {
      std::operator<<(out,"\n{ ");
      uVar6 = 1;
      for (lVar9 = 0; lVar10 != lVar9; lVar9 = lVar9 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar8,lVar9);
        std::ostream::operator<<(out,extraout_XMM0_Da_00);
        if (lVar9 < lVar4 + -1) {
          std::operator<<(out,", ");
        }
        if ((uVar6 / 6) * 6 + -1 == lVar9) {
          std::operator<<(out,'\n');
        }
        uVar6 = uVar6 + 1;
      }
      std::operator<<(out," }");
      if (lVar8 < lVar2 + -1) {
        std::operator<<(out,",");
      }
    }
    poVar3 = std::operator<<(out," };");
    std::endl<char,std::char_traits<char>>(poVar3);
    break;
  case EMatlabNonZeros:
    std::operator<<(out,name);
    lVar10 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar10;
    }
    if (lVar2 < 1) {
      lVar2 = lVar10;
    }
    local_148 = "\n";
    for (; lVar10 != lVar2; lVar10 = lVar10 + 1) {
      std::operator<<(out,"\n|");
      for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar10,lVar8);
        pcVar7 = ".";
        if (1e-06 <= ABS(extraout_XMM0_Da_01)) {
          pcVar7 = "#";
        }
        std::operator<<(out,pcVar7);
      }
      std::operator<<(out,"|");
    }
LAB_00d14e04:
    std::operator<<(out,local_148);
    break;
  case EMatrixMarket:
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    lVar4 = 0;
    if (0 < lVar2) {
      lVar4 = lVar2;
    }
    lVar10 = 0;
    while (lVar8 = lVar10, lVar8 != lVar4) {
      lVar5 = lVar8 + 1;
      if (iVar1 == 0) {
        lVar5 = lVar2;
      }
      if (lVar5 < 1) {
        lVar5 = 0;
      }
      for (lVar9 = 0; lVar10 = lVar8 + 1, lVar5 != lVar9; lVar9 = lVar9 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar8,lVar9);
      }
    }
    poVar3 = std::operator<<(out,"%%");
    poVar3 = std::operator<<(poVar3,name);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<long>((long)out);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar10 = 0;
    while (lVar8 = lVar10, lVar8 != lVar4) {
      lVar5 = lVar8 + 1;
      if (iVar1 == 0) {
        lVar5 = lVar2;
      }
      if (lVar5 < 1) {
        lVar5 = 0;
      }
      lVar9 = 0;
      while (lVar10 = lVar8 + 1, lVar9 != lVar5) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar8,lVar9);
        if ((extraout_XMM0_Da_04 != 0.0) || (NAN(extraout_XMM0_Da_04))) {
          poVar3 = std::ostream::_M_insert<long>((long)out);
          poVar3 = std::operator<<(poVar3,' ');
          lVar9 = lVar9 + 1;
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,extraout_XMM0_Da_04);
          std::operator<<(poVar3,'\n');
        }
        else {
          lVar9 = lVar9 + 1;
        }
      }
    }
    break;
  case ECSV:
    lVar8 = 0;
    lVar10 = lVar4;
    if (lVar4 < 1) {
      lVar10 = lVar8;
    }
    lVar5 = lVar2;
    if (lVar2 < 1) {
      lVar5 = lVar8;
    }
    for (; lVar8 != lVar5; lVar8 = lVar8 + 1) {
      for (lVar9 = 0; lVar10 != lVar9; lVar9 = lVar9 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar8,lVar9);
        std::ostream::operator<<(out,extraout_XMM0_Da_03);
        if (lVar9 < lVar4 + -1) {
          std::operator<<(out," , ");
        }
      }
      if (lVar8 < lVar2 + -1) {
        std::operator<<(out,"\n");
      }
    }
    break;
  case EFixedColumn:
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar3 = std::operator<<(out,"\' (");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"):\n");
    PrintVal.columnlength = 9;
    lVar10 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar10;
    }
    if (lVar2 < 1) {
      lVar2 = lVar10;
    }
    for (; lVar10 != lVar2; lVar10 = lVar10 + 1) {
      for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar10,lVar8);
        Print::anon_class_4_1_2f8713ba::operator()(&PrintVal,out,val);
      }
      std::operator<<(out,"\n");
    }
    std::operator<<(out,"\n");
  }
LAB_00d150d1:
  std::ios::copyfmt((ios *)(out + *(long *)(*(long *)out + -0x18)));
  std::ios_base::~ios_base((ios_base *)&cout_state);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}